

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O1

char lejp_globals_cb(lejp_ctx *ctx,char reason)

{
  char *dest;
  uint8_t uVar1;
  long *plVar2;
  undefined8 *puVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  
  if ((reason & 0x40U) == 0) {
    return '\0';
  }
  uVar1 = ctx->path_match;
  if (uVar1 == '\0') {
    return '\0';
  }
  plVar2 = (long *)ctx->user;
  if (uVar1 == '\v' && reason == 'M') {
    uVar6 = plVar2[5] & 0xf;
    if (uVar6 != 0) {
      plVar2[5] = (plVar2[5] - uVar6) + 0x10;
    }
    *(byte *)((long)plVar2 + 0xdc) = *(byte *)((long)plVar2 + 0xdc) & 0xef;
    puVar3 = (undefined8 *)plVar2[5];
    dest = (char *)(puVar3 + 4);
    plVar2[5] = (long)dest;
    iVar5 = lejp_get_wildcard(ctx,0,dest,(int)plVar2[6] - (int)dest);
    lVar4 = *plVar2;
    *puVar3 = *(undefined8 *)(lVar4 + 0x108);
    *(undefined8 **)(lVar4 + 0x108) = puVar3;
    lVar4 = plVar2[5];
    puVar3[2] = lVar4;
    _lws_log(4,"  adding rej %s=%s\n",lVar4,ctx->buf);
    lVar4 = plVar2[5];
    plVar2[5] = lVar4 + iVar5;
    *(undefined1 *)(lVar4 + -1 + (long)iVar5) = 0;
    puVar3[3] = plVar2[5];
    puVar3[1] = 0;
    goto LAB_0013c47a;
  }
  switch(uVar1) {
  case '\x01':
    iVar5 = atoi(ctx->buf);
    *(int *)(*plVar2 + 0x60) = iVar5;
    break;
  case '\x02':
    iVar5 = atoi(ctx->buf);
    *(int *)(*plVar2 + 0x5c) = iVar5;
    break;
  case '\x03':
    *(long *)(*plVar2 + 0x250) = plVar2[5];
    goto LAB_0013c47a;
  case '\x04':
    *(long *)(*plVar2 + 600) = plVar2[5];
    goto LAB_0013c47a;
  case '\x05':
    iVar5 = atoi(ctx->buf);
    *(int *)(*plVar2 + 0x94) = iVar5;
    break;
  case '\x06':
    iVar5 = arg_to_bool(ctx->buf);
    if (iVar5 != 0) {
      *(ulong *)(*plVar2 + 0x68) = *(ulong *)(*plVar2 + 0x68) | 0x1000;
    }
    break;
  case '\a':
    *(long *)(*plVar2 + 0xd8) = plVar2[5];
    goto LAB_0013c47a;
  case '\b':
    iVar5 = (int)plVar2[0x1b];
    if ((long)iVar5 == 9) {
      _lws_log(1,"Too many plugin dirs\n");
      return -1;
    }
    *(int *)(plVar2 + 0x1b) = iVar5 + 1;
    *(long *)(plVar2[0x1a] + (long)iVar5 * 8) = plVar2[5];
    goto LAB_0013c47a;
  case '\t':
    iVar5 = atoi(ctx->buf);
    *(short *)(*plVar2 + 0xf8) = (short)iVar5;
    break;
  case '\n':
    iVar5 = atoi(ctx->buf);
    *(int *)(*plVar2 + 0x9c) = iVar5;
    break;
  case '\r':
    *(long *)(*plVar2 + 0x1b0) = plVar2[5];
LAB_0013c47a:
    iVar5 = lws_snprintf((char *)plVar2[5],plVar2[6] - plVar2[5],"%s",ctx->buf);
    lVar4 = plVar2[5];
    plVar2[5] = (long)((undefined1 *)(iVar5 + lVar4) + 1);
    *(undefined1 *)(iVar5 + lVar4) = 0;
    return '\0';
  case '\x0e':
    iVar5 = atoi(ctx->buf);
    *(short *)(*plVar2 + 0x188) = (short)iVar5;
    break;
  case '\x0f':
    iVar5 = atoi(ctx->buf);
    *(short *)(*plVar2 + 0x18a) = (short)iVar5;
  }
  return '\0';
}

Assistant:

static signed char
lejp_globals_cb(struct lejp_ctx *ctx, char reason)
{
	struct jpargs *a = (struct jpargs *)ctx->user;
	struct lws_protocol_vhost_options *rej;
	int n;

	/* we only match on the prepared path strings */
	if (!(reason & LEJP_FLAG_CB_IS_VALUE) || !ctx->path_match)
		return 0;

	/* this catches, eg, vhosts[].headers[].xxx */
	if (reason == LEJPCB_VAL_STR_END &&
	    ctx->path_match == LWJPGP_REJECT_SERVICE_KEYWORDS_NAME + 1) {
		rej = lwsws_align(a);
		a->p += sizeof(*rej);

		n = lejp_get_wildcard(ctx, 0, a->p, lws_ptr_diff(a->end, a->p));
		rej->next = a->info->reject_service_keywords;
		a->info->reject_service_keywords = rej;
		rej->name = a->p;
		 lwsl_notice("  adding rej %s=%s\n", a->p, ctx->buf);
		a->p += n - 1;
		*(a->p++) = '\0';
		rej->value = a->p;
		rej->options = NULL;
		goto dostring;
	}

	switch (ctx->path_match - 1) {
	case LEJPGP_UID:
		a->info->uid = atoi(ctx->buf);
		return 0;
	case LEJPGP_GID:
		a->info->gid = atoi(ctx->buf);
		return 0;
	case LEJPGP_USERNAME:
		a->info->username = a->p;
		break;
	case LEJPGP_GROUPNAME:
		a->info->groupname = a->p;
		break;
	case LEJPGP_COUNT_THREADS:
		a->info->count_threads = atoi(ctx->buf);
		return 0;
	case LWJPGP_INIT_SSL:
		if (arg_to_bool(ctx->buf))
			a->info->options |= LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT;
		return 0;
	case LEJPGP_SERVER_STRING:
#if defined(LWS_WITH_SERVER)
		a->info->server_string = a->p;
#endif
		break;
	case LEJPGP_PLUGIN_DIR:
		if (a->count_plugin_dirs == MAX_PLUGIN_DIRS - 1) {
			lwsl_err("Too many plugin dirs\n");
			return -1;
		}
		a->plugin_dirs[a->count_plugin_dirs++] = a->p;
		break;

	case LWJPGP_PINGPONG_SECS:
		a->info->ws_ping_pong_interval = atoi(ctx->buf);
		return 0;

	case LWJPGP_TIMEOUT_SECS:
		a->info->timeout_secs = atoi(ctx->buf);
		return 0;

	case LWJPGP_DEFAULT_ALPN:
		a->info->alpn = a->p;
		break;

	case LWJPGP_IP_LIMIT_AH:
		a->info->ip_limit_ah = atoi(ctx->buf);
		return 0;

	case LWJPGP_IP_LIMIT_WSI:
		a->info->ip_limit_wsi = atoi(ctx->buf);
		return 0;

	default:
		return 0;
	}

dostring:
	a->p += lws_snprintf(a->p, a->end - a->p, "%s", ctx->buf);
	*(a->p)++ = '\0';

	return 0;
}